

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void InitParameterInteraction(ArgsManager *args)

{
  long lVar1;
  bool bVar2;
  int64_t iVar3;
  long lVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  long lVar5;
  pointer this;
  pointer pbVar6;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view logging_function_07;
  string_view logging_function_08;
  string_view logging_function_09;
  string_view logging_function_10;
  string_view logging_function_11;
  string_view logging_function_12;
  string_view logging_function_13;
  string_view logging_function_14;
  string_view logging_function_15;
  string_view logging_function_16;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view source_file_07;
  string_view source_file_08;
  string_view source_file_09;
  string_view source_file_10;
  string_view source_file_11;
  string_view source_file_12;
  string_view source_file_13;
  string_view source_file_14;
  string_view source_file_15;
  string_view source_file_16;
  allocator<char> local_9a;
  allocator<char> local_99;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  onlynets;
  string local_78;
  string proxy_arg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&proxy_arg,"-bind",(allocator<char> *)&local_78);
  bVar2 = ArgsManager::IsArgSet(args,&proxy_arg);
  std::__cxx11::string::~string((string *)&proxy_arg);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proxy_arg,"-listen",(allocator<char> *)&local_78);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&proxy_arg,true);
    std::__cxx11::string::~string((string *)&proxy_arg);
    if (bVar2) {
      logging_function._M_str = "InitParameterInteraction";
      logging_function._M_len = 0x18;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function,source_file,0x2db,ALL,Info,(ConstevalFormatString<0U>)0x68368f);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&proxy_arg,"-whitebind",(allocator<char> *)&local_78);
  bVar2 = ArgsManager::IsArgSet(args,&proxy_arg);
  std::__cxx11::string::~string((string *)&proxy_arg);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proxy_arg,"-listen",(allocator<char> *)&local_78);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&proxy_arg,true);
    std::__cxx11::string::~string((string *)&proxy_arg);
    if (bVar2) {
      logging_function_00._M_str = "InitParameterInteraction";
      logging_function_00._M_len = 0x18;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_00._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_00,source_file_00,0x2df,ALL,Info,
                 (ConstevalFormatString<0U>)0x6836d1);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&proxy_arg,"-connect",(allocator<char> *)&onlynets);
  bVar2 = ArgsManager::IsArgSet(args,&proxy_arg);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&proxy_arg);
LAB_001546cf:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proxy_arg,"-dnsseed",(allocator<char> *)&local_78);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&proxy_arg,false);
    std::__cxx11::string::~string((string *)&proxy_arg);
    if (bVar2) {
      logging_function_01._M_str = "InitParameterInteraction";
      logging_function_01._M_len = 0x18;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_01._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_01,source_file_01,0x2e5,ALL,Info,
                 (ConstevalFormatString<0U>)0x683726);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&proxy_arg,"-listen",(allocator<char> *)&local_78);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&proxy_arg,false);
    std::__cxx11::string::~string((string *)&proxy_arg);
    if (bVar2) {
      logging_function_02._M_str = "InitParameterInteraction";
      logging_function_02._M_len = 0x18;
      source_file_02._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_02._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_02,source_file_02,0x2e7,ALL,Info,
                 (ConstevalFormatString<0U>)0x683776);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-maxconnections",&local_99);
    iVar3 = ArgsManager::GetIntArg(args,&local_78,0x7d);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&proxy_arg);
    if (iVar3 < 1) goto LAB_001546cf;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"-proxy",&local_99);
  std::__cxx11::string::string<std::allocator<char>>((string *)&onlynets,"",&local_9a);
  ArgsManager::GetArg(&proxy_arg,args,&local_78,(string *)&onlynets);
  std::__cxx11::string::~string((string *)&onlynets);
  std::__cxx11::string::~string((string *)&local_78);
  bVar2 = std::operator==(&proxy_arg,"");
  if ((!bVar2) && (bVar2 = std::operator==(&proxy_arg,"0"), !bVar2)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-listen",(allocator<char> *)&onlynets);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_03._M_str = "InitParameterInteraction";
      logging_function_03._M_len = 0x18;
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_03._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_03,source_file_03,0x2ee,ALL,Info,
                 (ConstevalFormatString<0U>)0x6837cc);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-upnp",(allocator<char> *)&onlynets);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_04._M_str = "InitParameterInteraction";
      logging_function_04._M_len = 0x18;
      source_file_04._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_04._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_04,source_file_04,0x2f2,ALL,Info,
                 (ConstevalFormatString<0U>)0x683804);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-natpmp",(allocator<char> *)&onlynets);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_05._M_str = "InitParameterInteraction";
      logging_function_05._M_len = 0x18;
      source_file_05._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_05._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_05,source_file_05,0x2f4,ALL,Info,
                 (ConstevalFormatString<0U>)0x68383a);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-discover",(allocator<char> *)&onlynets);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_06._M_str = "InitParameterInteraction";
      logging_function_06._M_len = 0x18;
      source_file_06._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_06._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_06,source_file_06,0x2f8,ALL,Info,
                 (ConstevalFormatString<0U>)0x683872);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"-listen",(allocator<char> *)&onlynets);
  bVar2 = ArgsManager::GetBoolArg(args,&local_78,true);
  std::__cxx11::string::~string((string *)&local_78);
  if (!bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-upnp",(allocator<char> *)&onlynets);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_07._M_str = "InitParameterInteraction";
      logging_function_07._M_len = 0x18;
      source_file_07._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_07._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_07,source_file_07,0x2fe,ALL,Info,
                 (ConstevalFormatString<0U>)0x6838ac);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-natpmp",(allocator<char> *)&onlynets);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_08._M_str = "InitParameterInteraction";
      logging_function_08._M_len = 0x18;
      source_file_08._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_08._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_08,source_file_08,0x300,ALL,Info,
                 (ConstevalFormatString<0U>)0x6838e1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-discover",(allocator<char> *)&onlynets);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_09._M_str = "InitParameterInteraction";
      logging_function_09._M_len = 0x18;
      source_file_09._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_09._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_09,source_file_09,0x303,ALL,Info,
                 (ConstevalFormatString<0U>)0x683918);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-listenonion",(allocator<char> *)&onlynets);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_10._M_str = "InitParameterInteraction";
      logging_function_10._M_len = 0x18;
      source_file_10._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_10._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_10,source_file_10,0x305,ALL,Info,
                 (ConstevalFormatString<0U>)0x683951);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-i2pacceptincoming",(allocator<char> *)&onlynets);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_11._M_str = "InitParameterInteraction";
      logging_function_11._M_len = 0x18;
      source_file_11._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_11._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_11,source_file_11,0x307,ALL,Info,
                 (ConstevalFormatString<0U>)0x68398d);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"-externalip",(allocator<char> *)&onlynets);
  bVar2 = ArgsManager::IsArgSet(args,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-discover",(allocator<char> *)&onlynets);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_12._M_str = "InitParameterInteraction";
      logging_function_12._M_len = 0x18;
      source_file_12._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_12._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_12,source_file_12,0x30e,ALL,Info,
                 (ConstevalFormatString<0U>)0x6839db);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"-blocksonly",(allocator<char> *)&onlynets);
  bVar2 = ArgsManager::GetBoolArg(args,&local_78,false);
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-whitelistrelay",(allocator<char> *)&onlynets);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_13._M_str = "InitParameterInteraction";
      logging_function_13._M_len = 0x18;
      source_file_13._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_13._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_13,source_file_13,0x314,ALL,Info,
                 (ConstevalFormatString<0U>)0x683a1a);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"-maxmempool",&local_99);
    util::ToString<unsigned_int>((string *)&onlynets,&DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB);
    bVar2 = ArgsManager::SoftSetArg(args,&local_78,(string *)&onlynets);
    std::__cxx11::string::~string((string *)&onlynets);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_14._M_str = "InitParameterInteraction";
      logging_function_14._M_len = 0x18;
      source_file_14._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_14._M_len = 0x58;
      LogPrintFormatInternal<unsigned_int>
                (logging_function_14,source_file_14,0x317,ALL,Info,
                 (ConstevalFormatString<1U>)0x683a69,&DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"-whitelistforcerelay",(allocator<char> *)&onlynets);
  bVar2 = ArgsManager::GetBoolArg(args,&local_78,false);
  std::__cxx11::string::~string((string *)&local_78);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"-whitelistrelay",(allocator<char> *)&onlynets);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,true);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_15._M_str = "InitParameterInteraction";
      logging_function_15._M_len = 0x18;
      source_file_15._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_15._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_15,source_file_15,0x31d,ALL,Info,
                 (ConstevalFormatString<0U>)0x683aa9);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"-onlynet",(allocator<char> *)&onlynets);
  bVar2 = ArgsManager::IsArgSet(args,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  if (!bVar2) goto LAB_00154fd9;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"-onlynet",&local_99);
  __it._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  ArgsManager::GetArgs(&onlynets,args,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  lVar5 = (long)onlynets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)onlynets.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  this = onlynets.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  for (lVar4 = lVar5 >> 7; pbVar6 = this, 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<InitParameterInteraction(ArgsManager&)::$_0>::operator()
                      ((_Iter_pred<InitParameterInteraction(ArgsManager&)::__0> *)this,__it);
    if (bVar2) goto LAB_00154f66;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<InitParameterInteraction(ArgsManager&)::$_0>::operator()
                      ((_Iter_pred<InitParameterInteraction(ArgsManager&)::__0> *)(this + 1),__it);
    pbVar6 = this + 1;
    if (bVar2) goto LAB_00154f66;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<InitParameterInteraction(ArgsManager&)::$_0>::operator()
                      ((_Iter_pred<InitParameterInteraction(ArgsManager&)::__0> *)(this + 2),__it);
    pbVar6 = this + 2;
    if (bVar2) goto LAB_00154f66;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<InitParameterInteraction(ArgsManager&)::$_0>::operator()
                      ((_Iter_pred<InitParameterInteraction(ArgsManager&)::__0> *)(this + 3),__it);
    pbVar6 = this + 3;
    if (bVar2) goto LAB_00154f66;
    this = this + 4;
    lVar5 = lVar5 + -0x80;
  }
  lVar5 = lVar5 >> 5;
  if (lVar5 == 1) {
LAB_00154f55:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<InitParameterInteraction(ArgsManager&)::$_0>::operator()
                      ((_Iter_pred<InitParameterInteraction(ArgsManager&)::__0> *)this,__it);
    pbVar6 = this;
    if (!bVar2) {
      pbVar6 = onlynets.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
LAB_00154f66:
    if (pbVar6 == onlynets.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00154f6b;
  }
  else {
    if (lVar5 == 2) {
LAB_00154f45:
      bVar2 = __gnu_cxx::__ops::_Iter_pred<InitParameterInteraction(ArgsManager&)::$_0>::operator()
                        ((_Iter_pred<InitParameterInteraction(ArgsManager&)::__0> *)this,__it);
      pbVar6 = this;
      if (!bVar2) {
        this = this + 1;
        goto LAB_00154f55;
      }
      goto LAB_00154f66;
    }
    if (lVar5 == 3) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<InitParameterInteraction(ArgsManager&)::$_0>::operator()
                        ((_Iter_pred<InitParameterInteraction(ArgsManager&)::__0> *)this,__it);
      if (!bVar2) {
        this = this + 1;
        goto LAB_00154f45;
      }
      goto LAB_00154f66;
    }
LAB_00154f6b:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"-dnsseed",&local_99);
    bVar2 = ArgsManager::SoftSetBoolArg(args,&local_78,false);
    std::__cxx11::string::~string((string *)&local_78);
    if (bVar2) {
      logging_function_16._M_str = "InitParameterInteraction";
      logging_function_16._M_len = 0x18;
      source_file_16._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
      ;
      source_file_16._M_len = 0x58;
      LogPrintFormatInternal<>
                (logging_function_16,source_file_16,0x326,ALL,Info,
                 (ConstevalFormatString<0U>)0x683afe);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&onlynets);
LAB_00154fd9:
  std::__cxx11::string::~string((string *)&proxy_arg);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void InitParameterInteraction(ArgsManager& args)
{
    // when specifying an explicit binding address, you want to listen on it
    // even when -connect or -proxy is specified
    if (args.IsArgSet("-bind")) {
        if (args.SoftSetBoolArg("-listen", true))
            LogInfo("parameter interaction: -bind set -> setting -listen=1\n");
    }
    if (args.IsArgSet("-whitebind")) {
        if (args.SoftSetBoolArg("-listen", true))
            LogInfo("parameter interaction: -whitebind set -> setting -listen=1\n");
    }

    if (args.IsArgSet("-connect") || args.GetIntArg("-maxconnections", DEFAULT_MAX_PEER_CONNECTIONS) <= 0) {
        // when only connecting to trusted nodes, do not seed via DNS, or listen by default
        if (args.SoftSetBoolArg("-dnsseed", false))
            LogInfo("parameter interaction: -connect or -maxconnections=0 set -> setting -dnsseed=0\n");
        if (args.SoftSetBoolArg("-listen", false))
            LogInfo("parameter interaction: -connect or -maxconnections=0 set -> setting -listen=0\n");
    }

    std::string proxy_arg = args.GetArg("-proxy", "");
    if (proxy_arg != "" && proxy_arg != "0") {
        // to protect privacy, do not listen by default if a default proxy server is specified
        if (args.SoftSetBoolArg("-listen", false))
            LogInfo("parameter interaction: -proxy set -> setting -listen=0\n");
        // to protect privacy, do not map ports when a proxy is set. The user may still specify -listen=1
        // to listen locally, so don't rely on this happening through -listen below.
        if (args.SoftSetBoolArg("-upnp", false))
            LogInfo("parameter interaction: -proxy set -> setting -upnp=0\n");
        if (args.SoftSetBoolArg("-natpmp", false)) {
            LogInfo("parameter interaction: -proxy set -> setting -natpmp=0\n");
        }
        // to protect privacy, do not discover addresses by default
        if (args.SoftSetBoolArg("-discover", false))
            LogInfo("parameter interaction: -proxy set -> setting -discover=0\n");
    }

    if (!args.GetBoolArg("-listen", DEFAULT_LISTEN)) {
        // do not map ports or try to retrieve public IP when not listening (pointless)
        if (args.SoftSetBoolArg("-upnp", false))
            LogInfo("parameter interaction: -listen=0 -> setting -upnp=0\n");
        if (args.SoftSetBoolArg("-natpmp", false)) {
            LogInfo("parameter interaction: -listen=0 -> setting -natpmp=0\n");
        }
        if (args.SoftSetBoolArg("-discover", false))
            LogInfo("parameter interaction: -listen=0 -> setting -discover=0\n");
        if (args.SoftSetBoolArg("-listenonion", false))
            LogInfo("parameter interaction: -listen=0 -> setting -listenonion=0\n");
        if (args.SoftSetBoolArg("-i2pacceptincoming", false)) {
            LogInfo("parameter interaction: -listen=0 -> setting -i2pacceptincoming=0\n");
        }
    }

    if (args.IsArgSet("-externalip")) {
        // if an explicit public IP is specified, do not try to find others
        if (args.SoftSetBoolArg("-discover", false))
            LogInfo("parameter interaction: -externalip set -> setting -discover=0\n");
    }

    if (args.GetBoolArg("-blocksonly", DEFAULT_BLOCKSONLY)) {
        // disable whitelistrelay in blocksonly mode
        if (args.SoftSetBoolArg("-whitelistrelay", false))
            LogInfo("parameter interaction: -blocksonly=1 -> setting -whitelistrelay=0\n");
        // Reduce default mempool size in blocksonly mode to avoid unexpected resource usage
        if (args.SoftSetArg("-maxmempool", ToString(DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB)))
            LogInfo("parameter interaction: -blocksonly=1 -> setting -maxmempool=%d\n", DEFAULT_BLOCKSONLY_MAX_MEMPOOL_SIZE_MB);
    }

    // Forcing relay from whitelisted hosts implies we will accept relays from them in the first place.
    if (args.GetBoolArg("-whitelistforcerelay", DEFAULT_WHITELISTFORCERELAY)) {
        if (args.SoftSetBoolArg("-whitelistrelay", true))
            LogInfo("parameter interaction: -whitelistforcerelay=1 -> setting -whitelistrelay=1\n");
    }
    if (args.IsArgSet("-onlynet")) {
        const auto onlynets = args.GetArgs("-onlynet");
        bool clearnet_reachable = std::any_of(onlynets.begin(), onlynets.end(), [](const auto& net) {
            const auto n = ParseNetwork(net);
            return n == NET_IPV4 || n == NET_IPV6;
        });
        if (!clearnet_reachable && args.SoftSetBoolArg("-dnsseed", false)) {
            LogInfo("parameter interaction: -onlynet excludes IPv4 and IPv6 -> setting -dnsseed=0\n");
        }
    }
}